

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

void __thiscall booster::locale::impl_icu::num_parse<wchar_t>::~num_parse(num_parse<wchar_t> *this)

{
  ~num_parse(this);
  operator_delete(this);
  return;
}

Assistant:

num_parse(cdata const &d,size_t refs = 0) : 
        std::num_get<CharType>(refs),
        loc_(d.locale),
        enc_(d.encoding)
    {
    }